

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

void __thiscall
BCLog::Logger::LogPrintStr
          (Logger *this,string_view str,string_view logging_function,string_view source_file,
          int source_line,LogFlags category,Level level)

{
  long lVar1;
  string_view logging_function_00;
  string_view str_00;
  long in_FS_OFFSET;
  StdLockGuard *in_stack_00000008;
  StdLockGuard scoped_lock;
  char *in_stack_000000c0;
  size_t in_stack_000000c8;
  undefined1 in_stack_000001d0 [16];
  LogFlags in_stack_000001e0;
  Level in_stack_000001e8;
  StdLockGuard *in_stack_ffffffffffffff38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  StdLockGuard::StdLockGuard(in_stack_ffffffffffffff38,(StdMutex *)0xfe95a9);
  str_00._M_str = (char *)source_file._M_len;
  str_00._M_len = in_stack_000000c8;
  logging_function_00._M_str = in_stack_000000c0;
  logging_function_00._M_len = (size_t)str._M_str;
  LogPrintStr_(this,str_00,logging_function_00,(string_view)in_stack_000001d0,source_line,
               in_stack_000001e0,in_stack_000001e8);
  StdLockGuard::~StdLockGuard(in_stack_00000008);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BCLog::Logger::LogPrintStr(std::string_view str, std::string_view logging_function, std::string_view source_file, int source_line, BCLog::LogFlags category, BCLog::Level level)
{
    StdLockGuard scoped_lock(m_cs);
    return LogPrintStr_(str, logging_function, source_file, source_line, category, level);
}